

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

int writesettings(char *name)

{
  int __fd;
  size_t sVar1;
  ssize_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char buf [13];
  char fname [41];
  char local_78 [16];
  char local_68 [56];
  
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  if (canfd_mode == 1) {
    builtin_strncpy(local_68 + 8,"_fd.",5);
  }
  else {
    if (canfd_mode != 0) {
      puts("writesettings failed due to unspecified CAN FD mode");
      return 1;
    }
    local_68[8] = '.';
    local_68[9] = '\0';
  }
  builtin_strncpy(local_68,"sniffset",8);
  sVar1 = strlen(local_68);
  strncat(local_68,name,0x28 - sVar1);
  __fd = open(local_68,0x41,0x1a4);
  if (__fd < 1) {
    printf("unable to write setting file \'%s\'!\n",local_68);
    return 1;
  }
  if (0 < idx) {
    lVar4 = 0x106298;
    lVar6 = 0;
    do {
      sprintf(local_78,"<%08X>%c.",(ulong)sniftab[lVar6].current.can_id,
              (ulong)(sniftab[lVar6].flags & 1U | 0x30));
      sVar2 = write(__fd,local_78,0xc);
      if (sVar2 < 0) {
LAB_00102923:
        perror("write");
        return 1;
      }
      uVar5 = 0;
      do {
        sprintf(local_78,"%02X",(ulong)*(byte *)(lVar4 + uVar5));
        sVar2 = write(__fd,local_78,2);
        if (sVar2 < 0) goto LAB_00102923;
        uVar5 = uVar5 + 1;
        uVar3 = 8;
        if (max_dlen != '\0') {
          uVar3 = 0x40;
        }
      } while (uVar5 < uVar3);
      sVar2 = write(__fd,"\n",1);
      if (sVar2 < 0) goto LAB_00102923;
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x158;
    } while (lVar6 < idx);
  }
  close(__fd);
  return 0;
}

Assistant:

int writesettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	int i,j;
	char buf[13]= {0};

	if (canfd_mode == CANFD_OFF)
		strcpy(fname, SETFNAME);
	else if (canfd_mode == CANFD_ON)
		strcpy(fname, SETFDFNAME);
	else {
		printf("writesettings failed due to unspecified CAN FD mode\n");
		return 1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_WRONLY|O_CREAT, S_IRUSR|S_IWUSR|S_IRGRP|S_IROTH);
	if (fd <= 0) {
		printf("unable to write setting file '%s'!\n", fname);
		return 1;
	}

	for (i = 0; i < idx ;i++) {
		sprintf(buf, "<%08X>%c.", sniftab[i].current.can_id, (is_set(i, ENABLE))?'1':'0');
		if (write(fd, buf, 12) < 0) {
			perror("write");
			return 1;
		}
		for (j = 0; j < max_dlen ; j++) {
			sprintf(buf, "%02X", sniftab[i].notch.data[j]);
			if (write(fd, buf, 2) < 0) {
				perror("write");
				return 1;
			}
		}
		if (write(fd, "\n", 1) < 0) {
			perror("write");
			return 1;
		}
		/* Classical CAN: 12 + 16  + 1 = 29  bytes per entry */
		/* CAN FD:        12 + 128 + 1 = 141 bytes per entry */
	}
	close(fd);
	return 0;
}